

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initialize.cpp
# Opt level: O0

void __thiscall
glslang::TBuiltIns::addQueryFunctions
          (TBuiltIns *this,TSampler sampler,TString *typeName,int version,EProfile profile)

{
  bool bVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *local_b8;
  int local_a0;
  int local_9c;
  int f16TexAddr;
  int i;
  pool_allocator<char> local_90;
  undefined1 local_88 [8];
  TString funcName [2];
  int sizeDims;
  EProfile profile_local;
  int version_local;
  TString *typeName_local;
  TBuiltIns *this_local;
  TSampler sampler_local;
  
  iVar2 = (this->dimMap[(uint)sampler >> 8 & 0xff] + (uint)(((uint)sampler & 0x10000) != 0)) -
          (uint)(((uint)sampler >> 8 & 0xff) == 4);
  this_local._4_4_ = sampler;
  bVar1 = TSampler::isImage((TSampler *)((long)&this_local + 4));
  if ((!bVar1) ||
     (((profile != EEsProfile || (0x135 < version)) &&
      ((profile == EEsProfile || (0x1a3 < version)))))) {
    if (profile == EEsProfile) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(&(this->super_TBuiltInParseables).commonBuiltins,"highp ");
    }
    if (iVar2 == 1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(&(this->super_TBuiltInParseables).commonBuiltins,"int");
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(&(this->super_TBuiltInParseables).commonBuiltins,"ivec");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(&(this->super_TBuiltInParseables).commonBuiltins,this->postfixes[iVar2]);
    }
    bVar1 = TSampler::isImage((TSampler *)((long)&this_local + 4));
    if (bVar1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(&(this->super_TBuiltInParseables).commonBuiltins,
             " imageSize(readonly writeonly volatile coherent nontemporal ");
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(&(this->super_TBuiltInParseables).commonBuiltins," textureSize(");
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (&(this->super_TBuiltInParseables).commonBuiltins,typeName);
    bVar1 = TSampler::isImage((TSampler *)((long)&this_local + 4));
    if ((((bVar1) || (bVar1 = TSampler::isRect((TSampler *)((long)&this_local + 4)), bVar1)) ||
        (bVar1 = TSampler::isBuffer((TSampler *)((long)&this_local + 4)), bVar1)) ||
       (bVar1 = TSampler::isMultiSample((TSampler *)((long)&this_local + 4)), bVar1)) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(&(this->super_TBuiltInParseables).commonBuiltins,");\n");
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(&(this->super_TBuiltInParseables).commonBuiltins,",int);\n");
    }
    if (((profile != EEsProfile) && (0x1ad < version)) &&
       (bVar1 = TSampler::isMultiSample((TSampler *)((long)&this_local + 4)), bVar1)) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(&(this->super_TBuiltInParseables).commonBuiltins,"int ");
      bVar1 = TSampler::isImage((TSampler *)((long)&this_local + 4));
      if (bVar1) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(&(this->super_TBuiltInParseables).commonBuiltins,
               "imageSamples(readonly writeonly volatile coherent nontemporal ");
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(&(this->super_TBuiltInParseables).commonBuiltins,"textureSamples(");
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(&(this->super_TBuiltInParseables).commonBuiltins,typeName);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(&(this->super_TBuiltInParseables).commonBuiltins,");\n");
    }
    if (((profile != EEsProfile) && (0x95 < version)) &&
       ((bVar1 = TSampler::isCombined((TSampler *)((long)&this_local + 4)), bVar1 &&
        (((((uint)this_local._4_4_ >> 8 & 0xff) != 5 &&
          (bVar1 = TSampler::isMultiSample((TSampler *)((long)&this_local + 4)), !bVar1)) &&
         (bVar1 = TSampler::isBuffer((TSampler *)((long)&this_local + 4)), !bVar1)))))) {
      pool_allocator<char>::pool_allocator(&local_90);
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)local_88
                 ,"vec2 textureQueryLod(",&local_90);
      pool_allocator<char>::pool_allocator((pool_allocator<char> *)&f16TexAddr);
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 (funcName[0].field_2._M_local_buf + 8),"vec2 textureQueryLOD(",
                 (pool_allocator<char> *)&f16TexAddr);
      for (local_9c = 0; local_9c < 2; local_9c = local_9c + 1) {
        for (local_a0 = 0; local_a0 < 2; local_a0 = local_a0 + 1) {
          if ((local_a0 == 0) || (((uint)this_local._4_4_ & 0xff) == 3)) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::append((this->super_TBuiltInParseables).stageBuiltins + 4,
                     (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                     ((long)&funcName[(long)local_9c + -1].field_2 + 8));
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::append((this->super_TBuiltInParseables).stageBuiltins + 4,typeName);
            if (this->dimMap[(uint)this_local._4_4_ >> 8 & 0xff] == 1) {
              if (local_a0 == 0) {
                std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
                          ((this->super_TBuiltInParseables).stageBuiltins + 4,", float");
              }
              else {
                std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
                          ((this->super_TBuiltInParseables).stageBuiltins + 4,", float16_t");
              }
            }
            else {
              if (local_a0 == 0) {
                std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
                          ((this->super_TBuiltInParseables).stageBuiltins + 4,", vec");
              }
              else {
                std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
                          ((this->super_TBuiltInParseables).stageBuiltins + 4,", f16vec");
              }
              std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
                        ((this->super_TBuiltInParseables).stageBuiltins + 4,
                         this->postfixes[this->dimMap[(uint)this_local._4_4_ >> 8 & 0xff]]);
            }
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::append((this->super_TBuiltInParseables).stageBuiltins + 4,");\n");
          }
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append((this->super_TBuiltInParseables).stageBuiltins + 5,
               (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               ((long)&funcName[(long)local_9c + -1].field_2 + 8));
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append((this->super_TBuiltInParseables).stageBuiltins + 5,typeName);
        if (this->dimMap[(uint)this_local._4_4_ >> 8 & 0xff] == 1) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          append((this->super_TBuiltInParseables).stageBuiltins + 5,", float");
        }
        else {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          append((this->super_TBuiltInParseables).stageBuiltins + 5,", vec");
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          append((this->super_TBuiltInParseables).stageBuiltins + 5,
                 this->postfixes[this->dimMap[(uint)this_local._4_4_ >> 8 & 0xff]]);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append((this->super_TBuiltInParseables).stageBuiltins + 5,");\n");
      }
      local_b8 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                 ((long)&funcName[1].field_2 + 8);
      do {
        local_b8 = local_b8 + -1;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        ~basic_string(local_b8);
      } while (local_b8 !=
               (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               local_88);
    }
    if (((profile != EEsProfile) && (0x1ad < version)) &&
       ((bVar1 = TSampler::isImage((TSampler *)((long)&this_local + 4)), !bVar1 &&
        (((((uint)this_local._4_4_ >> 8 & 0xff) != 5 &&
          (bVar1 = TSampler::isMultiSample((TSampler *)((long)&this_local + 4)), !bVar1)) &&
         (bVar1 = TSampler::isBuffer((TSampler *)((long)&this_local + 4)), !bVar1)))))) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(&(this->super_TBuiltInParseables).commonBuiltins,"int textureQueryLevels(");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(&(this->super_TBuiltInParseables).commonBuiltins,typeName);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(&(this->super_TBuiltInParseables).commonBuiltins,");\n");
    }
  }
  return;
}

Assistant:

void TBuiltIns::addQueryFunctions(TSampler sampler, const TString& typeName, int version, EProfile profile)
{
    //
    // textureSize() and imageSize()
    //

    int sizeDims = dimMap[sampler.dim] + (sampler.arrayed ? 1 : 0) - (sampler.dim == EsdCube ? 1 : 0);

    if (sampler.isImage() && ((profile == EEsProfile && version < 310) || (profile != EEsProfile && version < 420)))
        return;

    if (profile == EEsProfile)
        commonBuiltins.append("highp ");
    if (sizeDims == 1)
        commonBuiltins.append("int");
    else {
        commonBuiltins.append("ivec");
        commonBuiltins.append(postfixes[sizeDims]);
    }
    if (sampler.isImage())
        commonBuiltins.append(" imageSize(readonly writeonly volatile coherent nontemporal ");
    else
        commonBuiltins.append(" textureSize(");
    commonBuiltins.append(typeName);
    if (! sampler.isImage() && ! sampler.isRect() && ! sampler.isBuffer() && ! sampler.isMultiSample())
        commonBuiltins.append(",int);\n");
    else
        commonBuiltins.append(");\n");

    //
    // textureSamples() and imageSamples()
    //

    // GL_ARB_shader_texture_image_samples
    // TODO: spec issue? there are no memory qualifiers; how to query a writeonly/readonly image, etc?
    if (profile != EEsProfile && version >= 430 && sampler.isMultiSample()) {
        commonBuiltins.append("int ");
        if (sampler.isImage())
            commonBuiltins.append("imageSamples(readonly writeonly volatile coherent nontemporal ");
        else
            commonBuiltins.append("textureSamples(");
        commonBuiltins.append(typeName);
        commonBuiltins.append(");\n");
    }

    //
    // textureQueryLod(), fragment stage only
    // Also enabled with extension GL_ARB_texture_query_lod
    // Extension GL_ARB_texture_query_lod says that textureQueryLOD() also exist at extension.

    if (profile != EEsProfile && version >= 150 && sampler.isCombined() && sampler.dim != EsdRect &&
        ! sampler.isMultiSample() && ! sampler.isBuffer()) {

        const TString funcName[2] = {"vec2 textureQueryLod(", "vec2 textureQueryLOD("};

        for (int i = 0; i < 2; ++i){
            for (int f16TexAddr = 0; f16TexAddr < 2; ++f16TexAddr) {
                if (f16TexAddr && sampler.type != EbtFloat16)
                    continue;
                stageBuiltins[EShLangFragment].append(funcName[i]);
                stageBuiltins[EShLangFragment].append(typeName);
                if (dimMap[sampler.dim] == 1)
                    if (f16TexAddr)
                        stageBuiltins[EShLangFragment].append(", float16_t");
                    else
                        stageBuiltins[EShLangFragment].append(", float");
                else {
                    if (f16TexAddr)
                        stageBuiltins[EShLangFragment].append(", f16vec");
                    else
                        stageBuiltins[EShLangFragment].append(", vec");
                    stageBuiltins[EShLangFragment].append(postfixes[dimMap[sampler.dim]]);
                }
                stageBuiltins[EShLangFragment].append(");\n");
            }

            stageBuiltins[EShLangCompute].append(funcName[i]);
            stageBuiltins[EShLangCompute].append(typeName);
            if (dimMap[sampler.dim] == 1)
                stageBuiltins[EShLangCompute].append(", float");
            else {
                stageBuiltins[EShLangCompute].append(", vec");
                stageBuiltins[EShLangCompute].append(postfixes[dimMap[sampler.dim]]);
            }
            stageBuiltins[EShLangCompute].append(");\n");
        }
    }

    //
    // textureQueryLevels()
    //

    if (profile != EEsProfile && version >= 430 && ! sampler.isImage() && sampler.dim != EsdRect &&
        ! sampler.isMultiSample() && ! sampler.isBuffer()) {
        commonBuiltins.append("int textureQueryLevels(");
        commonBuiltins.append(typeName);
        commonBuiltins.append(");\n");
    }
}